

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.c
# Opt level: O3

IceTImage icetReduceCompose(void)

{
  ulong uVar1;
  int *piVar2;
  uint uVar3;
  int iVar4;
  IceTSizeType height;
  bool bVar5;
  undefined1 auVar6 [16];
  IceTBoolean IVar7;
  int iVar8;
  IceTSizeType IVar9;
  IceTInt *pIVar10;
  IceTVoid *pIVar11;
  IceTVoid *pIVar12;
  IceTVoid *pIVar13;
  IceTVoid *__s;
  IceTVoid *pIVar14;
  IceTSparseImage IVar15;
  IceTSparseImage IVar16;
  IceTSparseImage IVar17;
  IceTImage IVar18;
  int iVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  IceTSizeType piece_offset_00;
  int iVar26;
  long lVar27;
  int *piVar28;
  long lVar29;
  ulong uVar30;
  IceTBoolean *pIVar31;
  IceTSizeType *pIVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  IceTInt num_processes;
  IceTSparseImage composited_image;
  IceTInt rank;
  IceTSizeType piece_offset;
  IceTSparseImage rendered_image;
  uint local_94;
  IceTSparseImage local_90;
  int local_88;
  IceTInt local_84;
  IceTInt *local_80;
  IceTBoolean *local_78;
  IceTSizeType local_6c;
  IceTVoid *local_68;
  IceTInt *local_60;
  IceTImage local_58;
  IceTBoolean *local_50;
  IceTInt *local_48;
  ulong local_40;
  IceTSparseImage local_38;
  
  local_78 = icetUnsafeStateGetBoolean(0x89);
  pIVar10 = icetUnsafeStateGetInteger(0x8a);
  icetGetIntegerv(0x8b,(IceTInt *)&local_38);
  local_58.opaque_internals = icetUnsafeStateGetInteger(0x1a);
  local_48 = icetUnsafeStateGetInteger(0x29);
  icetGetIntegerv(0x10,(IceTInt *)&local_90);
  icetGetIntegerv(3,(IceTInt *)&local_94);
  icetGetIntegerv(2,&local_88);
  if ((int)local_38.opaque_internals < 1) {
    uVar23 = 0xffffffff;
    local_60 = (IceTInt *)0x0;
    local_40 = 0;
  }
  else {
    pIVar11 = icetGetStateBuffer(0x1a5,(uint)local_90.opaque_internals << 2);
    pIVar12 = icetGetStateBuffer(0x1a6,local_94 << 2);
    pIVar13 = icetGetStateBuffer(0x1a7,(uint)local_90.opaque_internals * local_94 * 4);
    __s = icetGetStateBuffer(0x1a8,(uint)local_90.opaque_internals << 2);
    local_60 = (IceTInt *)icetGetStateBuffer(0x1a9,(uint)local_90.opaque_internals << 2);
    pIVar14 = icetGetStateBuffer(0x1aa,local_94 << 2);
    if ((int)(uint)local_90.opaque_internals < 1) {
      iVar19 = 0;
    }
    else {
      lVar27 = 0;
      iVar19 = 0;
      do {
        iVar26 = pIVar10[lVar27];
        iVar8 = (int)(local_94 * iVar26) / (int)local_38.opaque_internals;
        iVar22 = iVar8;
        if (iVar8 < 2) {
          iVar22 = 1;
        }
        if (0 < iVar26) {
          iVar8 = iVar22;
        }
        if (iVar26 <= iVar8) {
          iVar8 = iVar26;
        }
        *(int *)((long)pIVar11 + lVar27 * 4) = iVar8;
        iVar19 = iVar19 + iVar8;
        lVar27 = lVar27 + 1;
      } while (lVar27 < (int)(uint)local_90.opaque_internals);
    }
    for (; auVar6 = _DAT_0011f0f0, iVar19 < (int)local_94; iVar19 = iVar19 + 1) {
      if ((long)(int)(uint)local_90.opaque_internals < 2) {
        lVar27 = 0;
      }
      else {
        uVar25 = 0;
        uVar23 = 1;
        do {
          iVar26 = *(int *)((long)pIVar11 + uVar23 * 4);
          if (iVar26 < pIVar10[uVar23]) {
            iVar8 = *(int *)((long)pIVar11 + (long)(int)uVar25 * 4);
            if ((iVar8 == pIVar10[(int)uVar25]) ||
               (auVar37._0_4_ = (float)pIVar10[(int)uVar25], auVar37._4_4_ = (float)pIVar10[uVar23],
               auVar37._8_8_ = 0, auVar33._0_4_ = (float)iVar8, auVar33._4_4_ = (float)iVar26,
               auVar33._8_8_ = 0, auVar37 = divps(auVar37,auVar33), auVar37._0_4_ < auVar37._4_4_))
            {
              uVar25 = uVar23 & 0xffffffff;
            }
          }
          uVar23 = uVar23 + 1;
        } while ((long)(int)(uint)local_90.opaque_internals != uVar23);
        lVar27 = (long)(int)uVar25;
      }
      iVar26 = *(int *)((long)pIVar11 + lVar27 * 4);
      if (pIVar10[lVar27] <= iVar26) break;
      *(int *)((long)pIVar11 + lVar27 * 4) = iVar26 + 1;
    }
    for (; (int)local_94 < iVar19; iVar19 = iVar19 + -1) {
      if ((long)(int)(uint)local_90.opaque_internals < 2) {
        lVar27 = 0;
      }
      else {
        uVar25 = 0;
        uVar23 = 1;
        do {
          iVar26 = *(int *)((long)pIVar11 + uVar23 * 4);
          if (1 < iVar26) {
            uVar20 = *(uint *)((long)pIVar11 + (long)(int)uVar25 * 4);
            if (((int)uVar20 < 2) ||
               (auVar35._4_4_ = 0, auVar35._0_4_ = uVar20, auVar35._8_4_ = iVar26,
               auVar35._12_4_ = 0,
               auVar34._0_4_ = (float)(SUB168(auVar35 | auVar6,0) - auVar6._0_8_),
               auVar34._4_4_ = (float)(SUB168(auVar35 | auVar6,8) - auVar6._8_8_), auVar34._8_8_ = 0
               , auVar36._0_4_ = (float)pIVar10[(int)uVar25], auVar36._4_4_ = (float)pIVar10[uVar23]
               , auVar36._8_8_ = 0, auVar37 = divps(auVar36,auVar34), auVar37._4_4_ < auVar37._0_4_)
               ) {
              uVar25 = uVar23 & 0xffffffff;
            }
          }
          uVar23 = uVar23 + 1;
        } while ((long)(int)(uint)local_90.opaque_internals != uVar23);
        lVar27 = (long)(int)uVar25;
      }
      piVar2 = (int *)((long)pIVar11 + lVar27 * 4);
      *piVar2 = *piVar2 + -1;
    }
    memset(__s,0,(long)(int)(uint)local_90.opaque_internals << 2);
    uVar23 = (ulong)local_94;
    if (0 < (int)local_94) {
      lVar27 = 0;
      do {
        *(undefined4 *)((long)pIVar12 + lVar27 * 4) = 0xffffffff;
        lVar27 = lVar27 + 1;
        uVar23 = (ulong)(int)local_94;
      } while (lVar27 < (long)uVar23);
    }
    if (0 < (int)(uint)local_90.opaque_internals) {
      lVar27 = 0;
      do {
        if (0 < pIVar10[lVar27]) {
          *(int *)((long)pIVar12 + (long)*(int *)((long)local_58.opaque_internals + lVar27 * 4) * 4)
               = (int)lVar27;
          *(IceTInt *)
           ((long)pIVar13 +
           ((long)*(int *)((long)__s + lVar27 * 4) + (long)(int)lVar27 * (long)(int)local_94) * 4) =
               *(IceTInt *)((long)local_58.opaque_internals + lVar27 * 4);
          piVar2 = (int *)((long)__s + lVar27 * 4);
          *piVar2 = *piVar2 + 1;
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < (int)(uint)local_90.opaque_internals);
      uVar23 = (ulong)local_94;
    }
    if (0 < (int)uVar23) {
      lVar27 = 0;
      do {
        if ((*(int *)((long)pIVar12 + lVar27 * 4) < 0) &&
           (0 < (long)(int)(uint)local_90.opaque_internals)) {
          lVar24 = 0;
          do {
            if ((local_78[lVar24 + (int)((uint)local_90.opaque_internals * (int)lVar27)] != '\0') &&
               (*(int *)((long)__s + lVar24 * 4) < *(int *)((long)pIVar11 + lVar24 * 4))) {
              *(int *)((long)pIVar12 + lVar27 * 4) = (int)lVar24;
              *(int *)((long)pIVar13 +
                      ((long)*(int *)((long)__s + lVar24 * 4) +
                      (long)(int)lVar24 * (long)(int)local_94) * 4) = (int)lVar27;
              piVar2 = (int *)((long)__s + lVar24 * 4);
              *piVar2 = *piVar2 + 1;
              uVar23 = (ulong)local_94;
              break;
            }
            lVar24 = lVar24 + 1;
          } while ((int)(uint)local_90.opaque_internals != lVar24);
        }
        lVar27 = lVar27 + 1;
      } while (lVar27 < (int)uVar23);
    }
    local_40 = 0;
    local_84 = 0;
    if (0 < (int)(uint)local_90.opaque_internals) {
      lVar27 = 0;
      iVar19 = 0;
      do {
        if (*(int *)((long)__s + lVar27 * 4) < *(int *)((long)pIVar11 + lVar27 * 4)) {
          do {
            lVar24 = (long)iVar19;
            iVar19 = iVar19 + -1;
            piVar2 = (int *)(lVar24 * 4 + (long)pIVar12);
            do {
              piVar28 = piVar2;
              iVar19 = iVar19 + 1;
              piVar2 = piVar28 + 1;
            } while (-1 < *piVar28);
            *piVar28 = (int)lVar27;
            *(int *)((long)pIVar13 +
                    ((long)*(int *)((long)__s + lVar27 * 4) +
                    (long)(int)local_94 * (long)(int)lVar27) * 4) = iVar19;
            iVar26 = *(int *)((long)__s + lVar27 * 4) + 1;
            *(int *)((long)__s + lVar27 * 4) = iVar26;
          } while (iVar26 < *(int *)((long)pIVar11 + lVar27 * 4));
        }
        uVar23 = (ulong)(uint)local_90.opaque_internals;
        lVar27 = lVar27 + 1;
      } while (lVar27 < (int)(uint)local_90.opaque_internals);
      if ((int)(uint)local_90.opaque_internals < 1) {
        local_84 = 0;
      }
      else {
        local_80 = (IceTInt *)0x0;
        local_50 = local_78;
        uVar25 = 0;
        local_84 = 0;
        do {
          lVar27 = (long)(int)local_94;
          if ((uVar25 == *(uint *)((long)pIVar12 + (long)local_88 * 4)) ||
             (local_78[(long)local_88 * (long)(int)uVar23 + uVar25] != '\0')) {
            local_68 = (IceTVoid *)(uVar25 * lVar27 * 4 + (long)pIVar13);
            IVar7 = icetIsEnabled(0x142);
            if (IVar7 == '\0') {
              if ((uVar25 == *(uint *)((long)pIVar12 + (long)local_88 * 4)) &&
                 (local_78[(long)(int)(uint)local_90.opaque_internals * (long)local_88 + uVar25] !=
                  '\0')) {
                local_60[uVar25] = local_88;
              }
              iVar19 = 1;
              iVar26 = -1;
              lVar27 = -1;
              do {
                lVar24 = lVar27;
                do {
                  lVar27 = (long)(int)lVar24;
                  lVar29 = lVar24 << 0x20;
                  pIVar31 = local_50 + (lVar27 + 1) * (long)(int)(uint)local_90.opaque_internals;
                  do {
                    lVar27 = lVar27 + 1;
                    if ((int)local_94 <= lVar27) goto LAB_001170bc;
                    lVar29 = lVar29 + 0x100000000;
                    IVar7 = *pIVar31;
                    pIVar31 = pIVar31 + (int)(uint)local_90.opaque_internals;
                  } while (IVar7 == '\0');
                  lVar24 = lVar27;
                } while (uVar25 == *(uint *)((long)pIVar12 + (lVar29 >> 0x1e)));
                iVar8 = *(int *)((long)__s + uVar25 * 4);
                iVar22 = iVar19;
                do {
                  iVar21 = iVar26 + 1;
                  iVar19 = 0;
                  iVar26 = iVar21;
                  if (iVar8 <= iVar21) {
                    iVar26 = iVar19;
                  }
                  iVar4 = *(int *)((long)local_68 + (long)iVar26 * 4);
                } while ((((iVar21 < iVar8) && (iVar22 != 0)) &&
                         (iVar19 = iVar22,
                         local_78[(long)(int)(iVar4 * (uint)local_90.opaque_internals) + uVar25] !=
                         '\0')) &&
                        (iVar22 = 1, uVar25 == *(uint *)((long)pIVar12 + (long)iVar4 * 4)));
                if (local_88 == (int)lVar27) {
                  local_60[uVar25] = iVar4;
                }
              } while( true );
            }
            if ((int)local_94 < 1) {
              bVar5 = false;
              uVar20 = 0;
            }
            else {
              lVar24 = 0;
              uVar20 = 0;
              do {
                if (local_78[(long)(int)(uint)local_90.opaque_internals * (long)local_48[lVar24] +
                             uVar25] != '\0') {
                  *(IceTInt *)((long)pIVar14 + (long)(int)uVar20 * 4) = local_48[lVar24];
                  uVar20 = uVar20 + 1;
                }
                lVar24 = lVar24 + 1;
              } while (lVar24 < (int)local_94);
              if ((int)uVar20 < 1) {
                bVar5 = false;
              }
              else {
                uVar23 = 0;
                do {
                  uVar3 = *(uint *)((long)__s + uVar25 * 4);
                  iVar19 = *(int *)((long)pIVar14 + uVar23 * 4);
                  uVar30 = (ulong)uVar3;
                  if (uVar25 == *(uint *)((long)pIVar12 + (long)iVar19 * 4)) {
                    do {
                      if ((int)uVar30 < 1) goto LAB_00116f0b;
                      uVar1 = uVar30 - 1;
                      lVar24 = uVar30 * 4;
                      uVar30 = uVar1;
                    } while (*(int *)((long)pIVar13 + lVar24 + (long)local_80 * lVar27 + -4) !=
                             iVar19);
                    lVar24 = (long)((int)((int)uVar23 * uVar3) / (int)uVar20);
                    *(undefined4 *)((long)pIVar13 + uVar1 * 4 + (long)local_80 * lVar27) =
                         *(undefined4 *)((long)local_68 + lVar24 * 4);
                    *(int *)((long)local_68 + lVar24 * 4) = iVar19;
                  }
LAB_00116f0b:
                  uVar23 = uVar23 + 1;
                } while (uVar23 != uVar20);
                bVar5 = true;
              }
            }
            if ((uVar25 == *(uint *)((long)pIVar12 + (long)local_88 * 4)) &&
               (lVar24 = (long)*(int *)((long)__s + uVar25 * 4), 0 < lVar24)) {
              lVar29 = 0;
              do {
                if (*(int *)((long)pIVar13 + lVar29 * 4 + lVar27 * (long)local_80) ==
                    *(int *)((long)local_58.opaque_internals + uVar25 * 4)) {
                  local_84 = (IceTInt)lVar29;
                  break;
                }
                lVar29 = lVar29 + 1;
              } while (lVar24 != lVar29);
            }
            if (bVar5) {
              uVar23 = 0;
              do {
                if (*(int *)((long)pIVar14 + uVar23 * 4) == local_88) {
                  local_60[uVar25] =
                       *(IceTInt *)
                        ((long)local_68 +
                        (long)((*(int *)((long)__s + uVar25 * 4) * (int)uVar23) / (int)uVar20) * 4);
                }
                uVar23 = uVar23 + 1;
              } while (uVar20 != uVar23);
            }
          }
LAB_001170bc:
          uVar25 = uVar25 + 1;
          uVar23 = (ulong)(int)(uint)local_90.opaque_internals;
          local_80 = (IceTInt *)((long)local_80 + 4);
          local_50 = local_50 + 1;
        } while ((long)uVar25 < (long)uVar23);
      }
    }
    uVar23 = (ulong)*(int *)((long)pIVar12 + (long)local_88 * 4);
    if (-1 < (long)uVar23) {
      local_80 = (IceTInt *)((long)(int)local_94 * uVar23 * 4 + (long)pIVar13);
      local_40 = (ulong)*(uint *)((long)__s + uVar23 * 4);
      goto LAB_00117124;
    }
  }
  local_80 = (IceTInt *)0x0;
  local_84 = 0;
LAB_00117124:
  icetGetIntegerv(0x13,(IceTInt *)&local_90);
  icetGetIntegerv(0x14,(IceTInt *)&local_94);
  IVar9 = icetSparseImageBufferSize((uint)local_90.opaque_internals,local_94);
  pIVar11 = icetGetStateBuffer(0x1a1,IVar9);
  IVar15 = icetGetStateBufferSparseImage(0x1a0,(uint)local_90.opaque_internals,local_94);
  IVar16 = icetGetStateBufferSparseImage(0x1a2,(uint)local_90.opaque_internals,local_94);
  IVar17 = icetGetStateBufferSparseImage(0x1a3,(uint)local_90.opaque_internals,local_94);
  icetRenderTransferSparseImages(IVar16,IVar17,pIVar11,IVar15,local_60,&local_38);
  iVar19 = (int)uVar23;
  if (-1 < iVar19) {
    IVar15.opaque_internals._4_4_ = local_38.opaque_internals._4_4_;
    IVar15.opaque_internals._0_4_ = (int)local_38.opaque_internals;
    icetSingleImageCompose(local_80,(IceTInt)local_40,local_84,IVar15,&local_90,&local_6c);
  }
  IVar7 = icetIsEnabled(0x146);
  if (IVar7 == '\0') {
    IVar16.opaque_internals._4_4_ = local_90.opaque_internals._4_4_;
    IVar16.opaque_internals._0_4_ = (uint)local_90.opaque_internals;
    IVar9 = icetSparseImageGetNumPixels(IVar16);
    pIVar10 = icetUnsafeStateGetInteger(0x11);
    if (IVar9 < 1) {
      IVar18 = icetImageNull();
      icetStateSetInteger(0x8c,-1);
      icetStateSetInteger(0x8d,0);
      IVar9 = 0;
    }
    else {
      IVar18 = icetGetStateBufferImage(0x1a0,pIVar10[(long)iVar19 + 2],pIVar10[(long)iVar19 + 3]);
      IVar17.opaque_internals._4_4_ = local_90.opaque_internals._4_4_;
      IVar17.opaque_internals._0_4_ = (uint)local_90.opaque_internals;
      icetDecompressSubImage(IVar17,local_6c,IVar18);
      icetStateSetInteger(0x8c,iVar19);
      icetStateSetInteger(0x8d,local_6c);
    }
    icetStateSetInteger(0x8e,IVar9);
  }
  else {
    local_50 = (IceTBoolean *)CONCAT44(local_50._4_4_,local_6c);
    local_68 = (IceTVoid *)CONCAT44(local_90.opaque_internals._4_4_,(uint)local_90.opaque_internals)
    ;
    icetGetIntegerv(0x1b,(IceTInt *)&local_94);
    icetGetIntegerv(0x10,&local_88);
    pIVar10 = icetUnsafeStateGetInteger(0x11);
    local_80 = icetUnsafeStateGetInteger(0x1a);
    local_58 = icetImageNull();
    local_48 = (IceTInt *)uVar23;
    if (0 < local_88) {
      local_78 = (IceTBoolean *)(uVar23 & 0xffffffff);
      pIVar32 = pIVar10 + 3;
      pIVar31 = (IceTBoolean *)0x0;
      do {
        IVar9 = pIVar32[-1];
        height = *pIVar32;
        if (local_78 == pIVar31) {
          IVar15.opaque_internals = local_68;
          piece_offset_00 = (IceTSizeType)local_50;
          if (local_94 == (uint)local_48) {
LAB_001172b8:
            IVar18 = icetGetStateBufferImage(0x1a0,IVar9,height);
            local_58 = IVar18;
          }
          else {
            IVar18 = icetGetStateBufferImage(0x1a1,IVar9,height);
            IVar15.opaque_internals = local_68;
            piece_offset_00 = (IceTSizeType)local_50;
          }
        }
        else {
          IVar15 = icetSparseImageNull();
          piece_offset_00 = 0;
          if (pIVar31 == (IceTBoolean *)(ulong)local_94) goto LAB_001172b8;
          piece_offset_00 = 0;
          IVar18 = icetImageNull();
        }
        icetSingleImageCollect(IVar15,local_80[(long)pIVar31],piece_offset_00,IVar18);
        pIVar31 = pIVar31 + 1;
        pIVar32 = pIVar32 + 4;
      } while ((long)pIVar31 < (long)local_88);
    }
    icetGetIntegerv(0x1b,(IceTInt *)&local_94);
    IVar18.opaque_internals = local_58.opaque_internals;
    if ((-1 < (int)local_94) && (local_94 != (uint)local_48)) {
      icetClearImage(local_58);
    }
  }
  return (IceTImage)IVar18.opaque_internals;
}

Assistant:

static IceTInt reduceDelegate(IceTInt **tile_image_destp,
                              IceTInt **compose_groupp,
                              IceTInt *group_sizep,
                              IceTInt *group_image_destp)
{
    const IceTBoolean *all_contained_tiles_masks;
    const IceTInt *contrib_counts;
    IceTInt total_image_count;

    IceTInt num_tiles;
    IceTInt num_processes;
    IceTInt rank;
    const IceTInt *tile_display_nodes;
    const IceTInt *composite_order;

    IceTInt *num_proc_for_tile;
    IceTInt *node_assignment;
    IceTInt *tile_proc_groups;
    IceTInt *group_sizes;
    IceTInt *tile_image_dest;
    IceTInt group_image_dest = 0;
    IceTInt *contributors;

    IceTInt pcount;

    IceTInt tile, node;
    IceTInt snode, rnode, dest;
    IceTInt piece;
    IceTInt first_loop;

    all_contained_tiles_masks
        = icetUnsafeStateGetBoolean(ICET_ALL_CONTAINED_TILES_MASKS);
    contrib_counts = icetUnsafeStateGetInteger(ICET_TILE_CONTRIB_COUNTS);
    icetGetIntegerv(ICET_TOTAL_IMAGE_COUNT, &total_image_count);
    tile_display_nodes = icetUnsafeStateGetInteger(ICET_DISPLAY_NODES);
    composite_order = icetUnsafeStateGetInteger(ICET_COMPOSITE_ORDER);

    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_processes);
    icetGetIntegerv(ICET_RANK, &rank);

    if (total_image_count < 1) {
        icetRaiseDebug("No nodes are drawing.");
        *tile_image_destp = NULL;
        *compose_groupp = NULL;
        *group_sizep = 0;
        *group_image_destp = 0;
        return -1;
    }

    num_proc_for_tile = icetGetStateBuffer(REDUCE_NUM_PROC_FOR_TILE_BUFFER,
                                           num_tiles * sizeof(IceTInt));
    node_assignment   = icetGetStateBuffer(REDUCE_NODE_ASSIGNMENT_BUFFER,
                                           num_processes * sizeof(IceTInt));
    tile_proc_groups  = icetGetStateBuffer(REDUCE_TILE_PROC_GROUPS_BUFFER,
                                             num_tiles * num_processes
                                           * sizeof(IceTInt));
    group_sizes       = icetGetStateBuffer(REDUCE_GROUP_SIZES_BUFFER,
                                           num_tiles * sizeof(IceTInt));
    tile_image_dest   = icetGetStateBuffer(REDUCE_TILE_IMAGE_DEST_BUFFER,
                                           num_tiles * sizeof(IceTInt));
    contributors      = icetGetStateBuffer(REDUCE_CONTRIBUTORS_BUFFER,
                                           num_processes * sizeof(IceTInt));

  /* Decide the minimum amount of processes that should be added to each
     tile. */
    pcount = 0;
    for (tile = 0; tile < num_tiles; tile++) {
        IceTInt allocate = (contrib_counts[tile]*num_processes)/total_image_count;
      /* Make sure at least one process is assigned to tiles that have at
         least one image. */
        if ((allocate < 1) && (contrib_counts[tile] > 0)) allocate = 1;
      /* Don't allocate more processes to a tile than images for that
         tile. */
        if (allocate > contrib_counts[tile]) allocate = contrib_counts[tile];

        num_proc_for_tile[tile] = allocate;

      /* Keep track of how many processes have been allocated. */
        pcount += allocate;
    }

  /* Handle when we have not allocated all the processes. */
    while (num_processes > pcount) {
      /* Find the tile with the largest image to process ratio that
         can still have a process added to it. */
        IceTInt max = 0;
        for (tile = 1; tile < num_tiles; tile++) {
            if (   (num_proc_for_tile[tile] < contrib_counts[tile])
                && (   (num_proc_for_tile[max] == contrib_counts[max])
                    || (  (float)contrib_counts[max]/num_proc_for_tile[max]
                        < (float)contrib_counts[tile]/num_proc_for_tile[tile])))
            {
                max = tile;
            }
        }
        if (num_proc_for_tile[max] < contrib_counts[max]) {
            num_proc_for_tile[max]++;
            pcount++;
        } else {
          /* Cannot assign any more processes. */
            break;
        }
    }

  /* Handle when we have allocated too many processes. */
    while (num_processes < pcount) {
      /* Find tile with the smallest image to process ratio that can still
         have a process removed. */
        IceTInt min = 0;
        for (tile = 1; tile < num_tiles; tile++) {
            if (   (num_proc_for_tile[tile] > 1)
                && (   (num_proc_for_tile[min] < 2)
                    || (  (float)contrib_counts[min]/num_proc_for_tile[min]
                        > (float)contrib_counts[tile]/num_proc_for_tile[tile])))
            {
                min = tile;
            }
        }
        num_proc_for_tile[min]--;
        pcount--;
    }

  /* Clear out arrays. */
    memset(group_sizes, 0, num_tiles*sizeof(IceTInt));
    for (node = 0; node < num_processes; node++) {
        node_assignment[node] = -1;
    }

#define ASSIGN_NODE2TILE(node, tile)                                    \
node_assignment[(node)] = (tile);                                       \
tile_proc_groups[(tile)*num_processes + group_sizes[(tile)]] = (node);  \
group_sizes[(tile)]++;

  /* Assign each display node to the group processing that tile if there
     are any images in that tile. */
    for (tile = 0; tile < num_tiles; tile++) {
        if (contrib_counts[tile] > 0) {
            ASSIGN_NODE2TILE(tile_display_nodes[tile], tile);
        }
    }

  /* Assign each node to a tile it is rendering, if possible. */
    for (node = 0; node < num_processes; node++) {
        if (node_assignment[node] < 0) {
            const IceTBoolean *tile_mask
                = all_contained_tiles_masks + node*num_tiles;
            for (tile = 0; tile < num_tiles; tile++) {
                if (   (tile_mask[tile])
                    && (group_sizes[tile] < num_proc_for_tile[tile])) {
                    ASSIGN_NODE2TILE(node, tile);
                    break;
                }
            }
        }
    }

  /* Assign rest of the nodes. */
    node = 0;
    for (tile = 0; tile < num_tiles; tile++) {
        while (group_sizes[tile] < num_proc_for_tile[tile]) {
            while (node_assignment[node] >= 0) node++;
            ASSIGN_NODE2TILE(node, tile);
        }
    }

  /* Now figure out who I am sending to and how many I am receiving. */
    for (tile = 0; tile < num_tiles; tile++) {
        IceTInt *proc_group = tile_proc_groups + tile*num_processes;

        if (   (node_assignment[rank] != tile)
            && !all_contained_tiles_masks[rank*num_tiles + tile]) {
          /* Not involved with this tile.  Skip it. */
            continue;
        }

        if (!icetIsEnabled(ICET_ORDERED_COMPOSITE)) {
          /* If we are not doing an ordered composite, then we are free
           * to assign processes to images in any way we please.  Here we
           * will do everything we can to minimize communication. */

          /* First, have processes send images to themselves when possible. */
            if (   (node_assignment[rank] == tile)
                && all_contained_tiles_masks[rank*num_tiles + tile]) {
                tile_image_dest[tile] = rank;
            }

            snode = -1;
            rnode = -1;
            first_loop = 1;
            while (1) {
              /* Find next process that still needs a place to send images. */
                do {
                    snode++;
                } while (   (snode < num_processes)
                         && !all_contained_tiles_masks[snode*num_tiles + tile]);
                if (snode >= num_processes) {
                  /* We must be finished. */
                    break;
                }
                if (node_assignment[snode] == tile) {
                  /* This node keeps image in itself. */
                    continue;
                }

              /* Find the next process that can accept the image. */
                do {
                    rnode++;
                    if (rnode >= group_sizes[tile]) {
                        rnode = 0;
                        first_loop = 0;
                    }
                    dest = proc_group[rnode];
                } while (   first_loop
                         && all_contained_tiles_masks[dest*num_tiles + tile]
                         && (node_assignment[dest] == tile));

              /* Check to see if this node is sending the image data. */
                if (snode == rank) {
                    tile_image_dest[tile] = dest;
                }
            }
        } else {
          /* We are doing an ordered composite.  It is vital that each process
           * gets images that are consecutive in the ordering.  Communication
           * costs come second. */

            IceTInt num_contributors = 0;
            int i;
          /* First, we make a list of all processes contributing to this
           * tile in the order in which the images need to be composed.
           * We will then split this list into contiguous chunks and assign
           * each chunk to a process. */
            for (i = 0; i < num_processes; i++) {
                snode = composite_order[i];
                if (all_contained_tiles_masks[snode*num_tiles + tile]) {
                  /* The process snode contains an image for this tile.
                   * Add it to compositors. */
                    contributors[num_contributors] = snode;
                    num_contributors++;
                }
            }
#ifdef DEBUG
            if (num_contributors != contrib_counts[tile]) {
                icetRaiseError("Miscounted number of tile contributions",
                               ICET_SANITY_CHECK_FAIL);
            }
#endif

          /* contributors is split up as evenly as possible.  We will
           * assign nodes in the order they appear in proc_group.  We now
           * re-order proc_group to minimize the communications. */
            for (i = 0; i < num_contributors; i++) {
                piece = i*group_sizes[tile]/num_contributors;
                snode = contributors[i];
                if (node_assignment[snode] == tile) {
                  /* snode is part of this group.  Assign it to piece it is
                   * part of. */
                    int j;
                    for (j = group_sizes[tile]-1; j >=0; j--) {
                        if (proc_group[j] == snode) {
                          /* Found snode in proc_group.  Place it at
                           * "piece" in proc_group. */
                            proc_group[j] = proc_group[piece];
                            proc_group[piece] = snode;
                            break;
                        }
                    }
#ifdef DEBUG
                    if (j < 0) {
                        icetRaiseError("node_assignment/proc_group mismatch",
                                       ICET_SANITY_CHECK_FAIL);
                    }
#endif
                }
            }

          /* We have just shuffled proc_group, so the tile display node is
           * no longer necessarily at 0.  Find out where it should be. */
            if (node_assignment[rank] == tile) {
                for (i = 0; i < group_sizes[tile]; i++) {
                    if (proc_group[i] == tile_display_nodes[tile]) {
                        group_image_dest = i;
                        break;
                    }
                }
#ifdef DEBUG
                if (i == group_sizes[tile]) {
                    icetRaiseError("Display process not participating in tile?",
                                   ICET_SANITY_CHECK_FAIL);
                }
#endif
            }

          /* Assign nodes in the order they appear in proc_group. */
            for (i = 0; i < num_contributors; i++) {
                piece = i*group_sizes[tile]/num_contributors;
                snode = contributors[i];
                rnode = proc_group[piece];
                
              /* Check to see if this node is sending the image data. */
                if (snode == rank) {
                    tile_image_dest[tile] = rnode;
                }
            }
        }
    }

    *tile_image_destp = tile_image_dest;
    if (node_assignment[rank] < 0) {
        *compose_groupp = NULL;
        *group_sizep = 0;
        *group_image_destp = 0;
    } else {
        *compose_groupp = tile_proc_groups+node_assignment[rank]*num_processes;
        *group_sizep = group_sizes[node_assignment[rank]];
        *group_image_destp = group_image_dest;
    }
    return node_assignment[rank];
}